

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

bool __thiscall
SearcherPrincipalVariation::IsEndOfGame
          (SearcherPrincipalVariation *this,int *score,Position *pos,Moves *myMoves)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = IsDrawByRepetition(this,pos,score);
  if (bVar1) {
    return true;
  }
  iVar2 = 0;
  if (pos->m_nPlySinceCaptureOrPawnMove < 100) {
    bVar1 = Position::CanKingBeCapturedNow(pos);
    iVar2 = 1000000;
    if (!bVar1) {
      bVar1 = Position::IsStalemate(pos);
      iVar2 = 0;
      if (!bVar1) {
        bVar1 = Position::IsCheck(pos);
        if (bVar1) {
          (*(this->super_SearcherThreaded).super_SearcherReporting.super_SearcherBase.
            _vptr_SearcherBase[10])(this);
          (*(this->super_SearcherThreaded).super_SearcherReporting.super_SearcherBase.
            _vptr_SearcherBase[0xd])(this,myMoves,pos);
          if ((myMoves->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (myMoves->m_Moves).super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
              super__Vector_impl_data._M_start) {
            iVar2 = -1000000;
            goto LAB_00117c81;
          }
        }
        return false;
      }
    }
  }
LAB_00117c81:
  *score = iVar2;
  return true;
}

Assistant:

bool IsEndOfGame( int &score, Position &pos, Moves &myMoves )
    {
        if ( IsDrawByRepetition( pos, score ) )
            return true;

        if ( pos.GetPlySinceCaptureOrPawnMove() >= 100 )
        {
            score = DRAW_SCORE;
            return true;
        }

        if ( pos.CanKingBeCapturedNow() )
        {
            score = KING_VALUE;
            return true;
        }

        if ( pos.IsStalemate() )
        {
            score = DRAW_SCORE;
            return true;
        }

        if ( pos.IsCheck() )
        {
            ExtendSearchDepth();
            FilterCheckResolvingMoves( myMoves, pos );
            if ( myMoves.Count() == 0 )
            {
                // checkmate, no move possible
                score = -KING_VALUE;
                return true;
            }
        }

        return false;
    }